

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O1

int __thiscall pawn_table::init(pawn_table *this,EVP_PKEY_CTX *ctx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  size_t sVar3;
  element_type *peVar4;
  void *pvVar5;
  element_type *peVar6;
  ulong uVar7;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  this->sz_mb = 0x2800;
  this->count = 0x8a60;
  sVar3 = pow2(0x8a60);
  uVar8 = 0x400;
  if (0x400 < sVar3) {
    uVar8 = sVar3;
  }
  this->count = uVar8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  uVar7 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x128),8) == 0) {
    uVar7 = SUB168(auVar1 * ZEXT816(0x128),0);
  }
  peVar4 = (element_type *)operator_new__(uVar7);
  peVar6 = peVar4;
  do {
    peVar6->key = 0;
    peVar6->score = 0;
    peVar6 = peVar6 + 1;
  } while (peVar6 != peVar4 + uVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pawn_entry*,std::__sp_array_delete,std::allocator<void>,void>(a_Stack_20);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  pvVar5 = memset((this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,0,this->count * 0x128);
  return (int)pvVar5;
}

Assistant:

void pawn_table::init() {
	sz_mb = 10 * 1024; // todo : input mb parameter
	count = 1024 * sz_mb / sizeof(pawn_entry);
	count = pow2(count);
	count = (count < 1024 ? 1024 : count);
	entries = std::shared_ptr<pawn_entry[]>(new pawn_entry[count]());
	clear();
}